

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int lws_server_init_wsi_for_ws(lws *wsi)

{
  int iVar1;
  uchar *puVar2;
  uint local_1c;
  int n;
  lws *wsi_local;
  
  lwsi_set_state(wsi,0x119);
  local_1c = (uint)wsi->protocol->rx_buffer_size;
  if (local_1c == 0) {
    local_1c = wsi->context->pt_serv_buf_size;
  }
  puVar2 = (uchar *)lws_realloc((void *)0x0,(long)(int)(local_1c + 0x14),"rx_ubuf");
  wsi->ws->rx_ubuf = puVar2;
  if (wsi->ws->rx_ubuf == (uchar *)0x0) {
    _lws_log(1,"Out of Mem allocating rx buffer %d\n",(ulong)(local_1c + 0x10));
    wsi_local._4_4_ = 1;
  }
  else {
    wsi->ws->rx_ubuf_alloc = local_1c + 0x10;
    if ((wsi->protocol->callback == (lws_callback_function *)0x0) ||
       (iVar1 = (*wsi->protocol->callback)
                          (wsi,LWS_CALLBACK_ESTABLISHED,wsi->user_space,(wsi->tls).ssl,
                           (ulong)*(undefined8 *)&wsi->field_0x2dc >> 4 & 1), iVar1 == 0)) {
      lws_validity_confirmed(wsi);
      _lws_log(0x10,"ws established\n");
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_server_init_wsi_for_ws(struct lws *wsi)
{
	int n;

	lwsi_set_state(wsi, LRS_ESTABLISHED);

	/*
	 * create the frame buffer for this connection according to the
	 * size mentioned in the protocol definition.  If 0 there, use
	 * a big default for compatibility
	 */

	n = (int)wsi->protocol->rx_buffer_size;
	if (!n)
		n = wsi->context->pt_serv_buf_size;
	n += LWS_PRE;
	wsi->ws->rx_ubuf = lws_malloc(n + 4 /* 0x0000ffff zlib */, "rx_ubuf");
	if (!wsi->ws->rx_ubuf) {
		lwsl_err("Out of Mem allocating rx buffer %d\n", n);
		return 1;
	}
	wsi->ws->rx_ubuf_alloc = n;

	/* notify user code that we're ready to roll */

	if (wsi->protocol->callback)
		if (wsi->protocol->callback(wsi, LWS_CALLBACK_ESTABLISHED,
					    wsi->user_space,
#ifdef LWS_WITH_TLS
					    wsi->tls.ssl,
#else
					    NULL,
#endif
					    wsi->h2_stream_carries_ws))
			return 1;

	lws_validity_confirmed(wsi);
	lwsl_debug("ws established\n");

	return 0;
}